

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::UnitTestOptions::GetOutputFormat(void)

{
  char *__s;
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar2;
  String *in_RDI;
  String SVar3;
  char *colon;
  char *gtest_output_flag;
  
  __s = String::c_str((String *)FLAGS_gtest_output);
  if (__s == (char *)0x0) {
    String::String(in_RDI,"");
    sVar2 = extraout_RDX;
  }
  else {
    pcVar1 = strchr(__s,0x3a);
    if (pcVar1 == (char *)0x0) {
      String::String(in_RDI,__s);
      sVar2 = extraout_RDX_00;
    }
    else {
      String::String(in_RDI,__s,(long)pcVar1 - (long)__s);
      sVar2 = extraout_RDX_01;
    }
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)in_RDI;
  return SVar3;
}

Assistant:

String UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL) return String("");

  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      String(gtest_output_flag) :
      String(gtest_output_flag, colon - gtest_output_flag);
}